

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rcomp_byte(char *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  byte bVar2;
  void *__ptr;
  int iVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char cVar13;
  uchar *__s;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  Buffer_t *pBVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Buffer local_98;
  uint local_78;
  uint local_74;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  char *local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar16 = (ulong)(uint)nx;
  local_98.end = c + clen;
  local_98.start = c;
  local_98.current = c;
  __ptr = malloc((long)nblock * 4);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001bd613:
    local_98.start._0_4_ = -1;
  }
  else {
    local_98.bitbuffer = 0;
    local_98.bits_to_go = 8;
    output_nbits(&local_98,(int)*a,8);
    if (0 < nx) {
      cVar13 = *a;
      lVar11 = 0;
      local_68 = (ulong)(uint)nblock;
      local_60 = uVar16;
      local_58 = (long)nblock;
      local_48 = __ptr;
      do {
        uVar10 = uVar16 - lVar11;
        if (local_58 <= (long)(uVar16 - lVar11)) {
          uVar10 = local_68;
        }
        uVar9 = uVar10 & 0xffffffff;
        iVar15 = (int)uVar10;
        if (iVar15 < 1) {
          dVar18 = 0.0;
        }
        else {
          dVar18 = 0.0;
          uVar4 = 0;
          cVar5 = cVar13;
          do {
            cVar13 = a[uVar4];
            uVar6 = (int)((char)(cVar13 - cVar5) >> 7) ^ (char)(cVar13 - cVar5) * 2;
            *(uint *)((long)__ptr + uVar4 * 4) = uVar6;
            dVar18 = dVar18 + (double)(int)uVar6;
            uVar4 = uVar4 + 1;
            cVar5 = cVar13;
          } while ((uVar10 & 0xffffffff) != uVar4);
        }
        dVar20 = ((dVar18 - (double)((int)(((uint)(uVar10 >> 0x1f) & 1) + iVar15) >> 1)) + -1.0) /
                 (double)iVar15;
        dVar19 = 0.0;
        if (0.0 <= dVar20) {
          dVar19 = dVar20;
        }
        bVar2 = (byte)(int)dVar19;
        local_68 = uVar9;
        local_50 = a;
        if (bVar2 < 2) {
          if ((dVar18 != 0.0) || (NAN(dVar18))) {
            uVar16 = 0;
LAB_001bd448:
            local_70 = lVar11;
            output_nbits(&local_98,(int)uVar16 + 1,3);
            pBVar17 = local_98.current;
            uVar6 = local_98.bitbuffer;
            iVar8 = local_98.bits_to_go;
            if (0 < iVar15) {
              uVar14 = ~(-1 << ((byte)uVar16 & 0x1f));
              uVar10 = 0;
              local_78 = uVar14;
              local_40 = uVar9;
              local_38 = uVar16;
              do {
                uVar12 = *(uint *)((long)__ptr + uVar10 * 4);
                iVar15 = (int)uVar12 >> ((byte)uVar16 & 0x1f);
                uVar7 = iVar15 - iVar8;
                if (iVar15 < iVar8) {
                  uVar6 = uVar6 << ((byte)(iVar15 + 1) & 0x1f) | 1;
                  iVar15 = iVar8 - (iVar15 + 1);
                }
                else {
                  __s = pBVar17 + 1;
                  *pBVar17 = (uchar)(uVar6 << ((byte)iVar8 & 0x1f));
                  if (7 < (int)uVar7) {
                    if (0xe < uVar7) {
                      uVar7 = 0xf;
                    }
                    uVar6 = (iVar15 - (uVar7 + iVar8)) + 7;
                    uVar16 = (ulong)(uVar6 >> 3);
                    local_74 = uVar12;
                    memset(__s,0,uVar16 + 1);
                    __s = pBVar17 + uVar16 + 2;
                    uVar7 = (iVar15 - ((uVar6 & 0xfffffff8) + iVar8)) - 8;
                    uVar9 = local_40;
                    __ptr = local_48;
                    uVar16 = local_38;
                    uVar14 = local_78;
                    uVar12 = local_74;
                  }
                  iVar15 = 7 - uVar7;
                  uVar6 = 1;
                  pBVar17 = __s;
                }
                iVar8 = iVar15;
                if (1 < bVar2) {
                  iVar3 = (int)uVar16;
                  uVar6 = uVar12 & uVar14 | uVar6 << ((byte)uVar16 & 0x1f);
                  iVar8 = iVar15 - iVar3;
                  if (iVar8 == 0 || iVar15 < iVar3) {
                    iVar3 = iVar3 - iVar15;
                    iVar15 = iVar8;
                    do {
                      *pBVar17 = (uchar)((int)uVar6 >> ((byte)iVar3 & 0x1f));
                      pBVar17 = pBVar17 + 1;
                      iVar8 = iVar15 + 8;
                      iVar3 = iVar3 + -8;
                      bVar1 = iVar15 < -7;
                      iVar15 = iVar8;
                    } while (bVar1);
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar9);
            }
            local_98.current = pBVar17;
            if (local_98.end < pBVar17) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001bd613;
            }
            local_98.bits_to_go = iVar8;
            local_98.bitbuffer = uVar6;
            lVar11 = local_70;
            uVar16 = local_60;
          }
          else {
            output_nbits(&local_98,0,3);
          }
        }
        else {
          uVar14 = (int)dVar19 & 0xff;
          uVar6 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          if ((byte)uVar6 < 6) {
            uVar16 = (ulong)(uVar6 & 0xff);
            goto LAB_001bd448;
          }
          output_nbits(&local_98,7,3);
          if (0 < iVar15) {
            uVar10 = local_68 & 0xffffffff;
            uVar9 = 0;
            do {
              output_nbits(&local_98,*(int *)((long)__ptr + uVar9 * 4),8);
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
        }
        lVar11 = lVar11 + local_58;
        a = local_50 + local_58;
      } while (lVar11 < (long)uVar16);
    }
    pBVar17 = local_98.current;
    if (local_98.bits_to_go < 8) {
      *local_98.current = (uchar)(local_98.bitbuffer << ((byte)local_98.bits_to_go & 0x1f));
      pBVar17 = local_98.current + 1;
    }
    free(__ptr);
    local_98.start._0_4_ = (int)pBVar17 - (int)local_98.start;
  }
  return (int)local_98.start;
}

Assistant:

int fits_rcomp_byte(
	  signed char a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize; */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
signed char pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned char psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 1;  */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 3;
    fsmax = 6;
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first byte value to the first  byte of the buffer */
    if (output_nbits(buffer, a[0], 8) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned char) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}